

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O2

void __thiscall QPlatformPrintDevice::~QPlatformPrintDevice(QPlatformPrintDevice *this)

{
  ~QPlatformPrintDevice(this);
  operator_delete(this,0x158);
  return;
}

Assistant:

QPlatformPrintDevice::~QPlatformPrintDevice()
{
}